

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::UpdateWitnessStackRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::UpdateWitnessStackRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateWitnessStackRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  UpdateWitnessStackRequestStruct request;
  RawTransactionResponseStruct response;
  RawTransactionResponse res;
  UpdateWitnessStackRequest req;
  string local_488;
  UpdateWitnessStackRequestStruct local_468;
  RawTransactionResponseStruct local_310;
  ErrorResponse local_248;
  UpdateWitnessStackRequest local_190;
  
  UpdateWitnessStackRequest::UpdateWitnessStackRequest(&local_190);
  core::JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>::Deserialize
            (&local_190.super_JsonClassBase<cfd::js::api::json::UpdateWitnessStackRequest>,
             (string *)this);
  UpdateWitnessStackRequest::ConvertToStruct(&local_468,&local_190);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_310,request_message,&local_468);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_310.error.code == 0) {
      RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)&local_248);
      RawTransactionResponse::ConvertFromStruct((RawTransactionResponse *)&local_248,&local_310);
      core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
                (&local_488,(JsonClassBase<cfd::js::api::json::RawTransactionResponse> *)&local_248)
      ;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p);
      }
      RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)&local_248);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_248,&local_310.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_488,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_248);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_488);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_dataplus._M_p != &local_488.field_2) {
        operator_delete(local_488._M_dataplus._M_p);
      }
      local_248.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_248.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_248.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_310.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_310.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.error.message._M_dataplus._M_p != &local_310.error.message.field_2) {
      operator_delete(local_310.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.error.type._M_dataplus._M_p != &local_310.error.type.field_2) {
      operator_delete(local_310.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.hex._M_dataplus._M_p != &local_310.hex.field_2) {
      operator_delete(local_310.hex._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_468.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_468.txin.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_468.txin.witness_stack.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468.txin.witness_stack.sighash_type._M_dataplus._M_p !=
        &local_468.txin.witness_stack.sighash_type.field_2) {
      operator_delete(local_468.txin.witness_stack.sighash_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468.txin.witness_stack.type._M_dataplus._M_p !=
        &local_468.txin.witness_stack.type.field_2) {
      operator_delete(local_468.txin.witness_stack.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468.txin.witness_stack.hex._M_dataplus._M_p !=
        &local_468.txin.witness_stack.hex.field_2) {
      operator_delete(local_468.txin.witness_stack.hex._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468.txin.txid._M_dataplus._M_p != &local_468.txin.txid.field_2) {
      operator_delete(local_468.txin.txid._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468.tx._M_dataplus._M_p != &local_468.tx.field_2) {
      operator_delete(local_468.tx._M_dataplus._M_p);
    }
    UpdateWitnessStackRequest::~UpdateWitnessStackRequest(&local_190);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)&local_248);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_310);
  UpdateWitnessStackRequestStruct::~UpdateWitnessStackRequestStruct(&local_468);
  UpdateWitnessStackRequest::~UpdateWitnessStackRequest(&local_190);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}